

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O2

void ON_SortIntArray(sort_algorithm sort_algorithm,int *a,size_t nel)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  int *piVar11;
  int *piVar12;
  ulong uVar13;
  int *lostk [62];
  undefined8 auStack_408 [62];
  undefined8 auStack_218 [63];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (int *)0x0) {
      uVar4 = nel >> 1;
      piVar3 = a + (nel - 1);
      uVar5 = nel - 1;
LAB_005bb491:
      if (uVar4 == 0) {
        iVar2 = *piVar3;
        *piVar3 = *a;
        uVar5 = uVar5 - 1;
        if (uVar5 == 0) {
          *a = iVar2;
          return;
        }
        piVar3 = piVar3 + -1;
        uVar4 = 0;
      }
      else {
        iVar2 = a[uVar4 - 1];
        uVar4 = uVar4 - 1;
      }
      piVar6 = a + uVar4;
      uVar13 = uVar4;
      do {
        uVar1 = uVar13 * 2;
        do {
          uVar13 = uVar1 + 1;
          if (uVar5 < uVar13) {
            *piVar6 = iVar2;
            goto LAB_005bb491;
          }
          piVar9 = a + uVar13;
          if (uVar13 < uVar5) {
            iVar7 = *piVar9;
            iVar10 = piVar9[1];
            iVar8 = iVar7;
            if (iVar7 < iVar10) {
              piVar9 = piVar9 + 1;
              iVar8 = iVar10;
            }
            uVar13 = uVar13 + (iVar7 < iVar10);
          }
          else {
            iVar8 = *piVar9;
          }
          uVar1 = uVar5;
        } while (iVar8 <= iVar2);
        *piVar6 = iVar8;
        piVar6 = piVar9;
      } while( true );
    }
  }
  else if (1 < nel && a != (int *)0x0) {
    uVar4 = 0;
    piVar3 = a + (nel - 1);
LAB_005bb2af:
    while( true ) {
      iVar2 = (int)uVar4;
      uVar5 = ((long)piVar3 - (long)a >> 2) + 1;
      if (uVar5 < 9) break;
      piVar6 = (int *)((long)a + (uVar5 & 0xfffffffffffffffe) * 2);
      iVar8 = *a;
      iVar10 = *piVar6;
      iVar7 = iVar8;
      if (iVar10 < iVar8) {
        *a = iVar10;
        *piVar6 = iVar8;
        iVar7 = *a;
        iVar10 = iVar8;
      }
      iVar8 = *piVar3;
      if (iVar8 < iVar7) {
        *a = iVar8;
        *piVar3 = iVar7;
        iVar10 = *piVar6;
        iVar8 = iVar7;
      }
      piVar9 = a;
      piVar11 = piVar3;
      if (iVar8 < iVar10) {
        *piVar6 = iVar8;
        *piVar3 = iVar10;
      }
LAB_005bb307:
      if (piVar9 < piVar6) {
        do {
          piVar9 = piVar9 + 1;
          if (piVar6 <= piVar9) break;
        } while (*piVar9 <= *piVar6);
      }
      if (piVar6 <= piVar9) {
        do {
          piVar9 = piVar9 + 1;
          if (piVar3 < piVar9) break;
        } while (*piVar9 <= *piVar6);
      }
      do {
        piVar12 = piVar11;
        piVar11 = piVar12 + -1;
        if (piVar11 <= piVar6) break;
      } while (*piVar6 < *piVar11);
      if (piVar9 <= piVar11) {
        iVar8 = *piVar9;
        *piVar9 = *piVar11;
        *piVar11 = iVar8;
        if (piVar11 == piVar6) {
          piVar6 = piVar9;
        }
        goto LAB_005bb307;
      }
      if (piVar6 < piVar12) {
        do {
          piVar12 = piVar11;
          if (piVar12 <= piVar6) break;
          piVar11 = piVar12 + -1;
        } while (*piVar12 == *piVar6);
      }
      if (piVar12 <= piVar6) {
        do {
          piVar12 = piVar12 + -1;
          if (piVar12 <= a) break;
        } while (*piVar12 == *piVar6);
      }
      if ((long)piVar12 - (long)a < (long)piVar3 - (long)piVar9) goto LAB_005bb42d;
      if (a < piVar12) {
        auStack_218[iVar2] = a;
        auStack_408[iVar2] = piVar12;
        uVar4 = (ulong)(iVar2 + 1);
      }
      iVar2 = (int)uVar4;
      a = piVar9;
      if (piVar3 <= piVar9) goto LAB_005bb44f;
    }
    for (; piVar9 = a, piVar6 = a, a < piVar3; piVar3 = piVar3 + -1) {
      while (piVar11 = piVar9, piVar6 = piVar6 + 1, piVar6 <= piVar3) {
        piVar9 = piVar6;
        if (*piVar6 <= *piVar11) {
          piVar9 = piVar11;
        }
      }
      iVar8 = *piVar11;
      *piVar11 = *piVar3;
      *piVar3 = iVar8;
    }
    goto LAB_005bb44f;
  }
  return;
LAB_005bb42d:
  if (piVar9 < piVar3) {
    auStack_218[iVar2] = piVar9;
    auStack_408[iVar2] = piVar3;
    uVar4 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar4;
  piVar3 = piVar12;
  if (piVar12 <= a) {
LAB_005bb44f:
    if (iVar2 < 1) {
      return;
    }
    uVar4 = (ulong)(iVar2 - 1);
    a = (int *)auStack_218[uVar4];
    piVar3 = (int *)auStack_408[uVar4];
  }
  goto LAB_005bb2af;
}

Assistant:

void ON_SortIntArray(
        ON::sort_algorithm sort_algorithm,
        int* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_int(a,nel);
  else
    ON_qsort_int(a,nel);
}